

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covBuild.c
# Opt level: O3

Abc_Obj_t * Abc_NtkCovDerive_rec(Cov_Man_t *p,Abc_Ntk_t *pNtkNew,Abc_Obj_t *pObj)

{
  long *plVar1;
  Vec_Int_t *vSupp;
  Vec_Ptr_t *pVVar2;
  bool bVar3;
  int iVar4;
  Min_Cube_t *pCube_11;
  Min_Cube_t *pMVar5;
  Abc_Obj_t *pObj_00;
  Vec_Str_t *vCover;
  char *pcVar6;
  Min_Cube_t *pCube_9;
  Min_Cube_t *pMVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  Min_Cube_t *pMVar11;
  Min_Cube_t *pCube;
  undefined8 uStack_38;
  
  if ((Abc_Obj_t *)(pObj->field_6).pTemp != (Abc_Obj_t *)0x0) {
    return (Abc_Obj_t *)(pObj->field_6).pTemp;
  }
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covBuild.c"
                  ,0x197,"Abc_Obj_t *Abc_NtkCovDerive_rec(Cov_Man_t *, Abc_Ntk_t *, Abc_Obj_t *)");
  }
  iVar4 = pObj->Id;
  if (((long)iVar4 < 0) ||
     (lVar9 = *(long *)((long)pObj->pNtk->pManCut + 0x18), *(int *)(lVar9 + 4) <= iVar4)) {
LAB_008bf039:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  plVar1 = *(long **)(*(long *)(lVar9 + 8) + (long)iVar4 * 8);
  vSupp = (Vec_Int_t *)plVar1[3];
  if (vSupp == (Vec_Int_t *)0x0) {
    __assert_fail("vSupp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covBuild.c"
                  ,0x19a,"Abc_Obj_t *Abc_NtkCovDerive_rec(Cov_Man_t *, Abc_Ntk_t *, Abc_Obj_t *)");
  }
  pMVar7 = (Min_Cube_t *)*plVar1;
  pMVar5 = (Min_Cube_t *)plVar1[1];
  pCube = (Min_Cube_t *)plVar1[2];
  if (pMVar7 == (Min_Cube_t *)0x0) {
    if (pMVar5 == (Min_Cube_t *)0x0) {
      if (pCube == (Min_Cube_t *)0x0) goto LAB_008bf096;
      uStack_38 = 0x78000000;
      goto LAB_008beee5;
    }
LAB_008bede5:
    if (pCube != (Min_Cube_t *)0x0) {
      uVar8 = 0xffffffff;
      pMVar11 = pMVar5;
      do {
        pMVar11 = pMVar11->pNext;
        uVar8 = uVar8 + 1;
      } while (pMVar11 != (Min_Cube_t *)0x0);
      uVar10 = 0xffffffff;
      pMVar11 = pCube;
      do {
        pMVar11 = pMVar11->pNext;
        uVar10 = uVar10 + 1;
      } while (pMVar11 != (Min_Cube_t *)0x0);
      if (uVar10 < uVar8) {
LAB_008bee1a:
        bVar3 = false;
        goto LAB_008bee65;
      }
    }
    uStack_38 = 0x130000000;
    pCube = pMVar5;
  }
  else {
    if (pMVar5 == (Min_Cube_t *)0x0) {
LAB_008bed74:
      if (pCube != (Min_Cube_t *)0x0) {
        uVar8 = 0xffffffff;
        pMVar11 = pMVar7;
        do {
          pMVar11 = pMVar11->pNext;
          uVar8 = uVar8 + 1;
        } while (pMVar11 != (Min_Cube_t *)0x0);
        uVar10 = 0xffffffff;
        pMVar11 = pCube;
        do {
          pMVar11 = pMVar11->pNext;
          uVar10 = uVar10 + 1;
        } while (pMVar11 != (Min_Cube_t *)0x0);
        if (uVar10 < uVar8) goto LAB_008bedad;
      }
      uStack_38 = 0x31000000;
      pCube = pMVar7;
      goto LAB_008beee5;
    }
    uVar8 = 0xffffffff;
    pMVar11 = pMVar7;
    do {
      pMVar11 = pMVar11->pNext;
      uVar8 = uVar8 + 1;
    } while (pMVar11 != (Min_Cube_t *)0x0);
    uVar10 = 0xffffffff;
    pMVar11 = pMVar5;
    do {
      pMVar11 = pMVar11->pNext;
      uVar10 = uVar10 + 1;
    } while (pMVar11 != (Min_Cube_t *)0x0);
    if (uVar8 <= uVar10) goto LAB_008bed74;
LAB_008bedad:
    if (pMVar5 != (Min_Cube_t *)0x0) {
      uVar8 = 0xffffffff;
      pMVar11 = pMVar5;
      do {
        pMVar11 = pMVar11->pNext;
        uVar8 = uVar8 + 1;
      } while (pMVar11 != (Min_Cube_t *)0x0);
      uVar10 = 0xffffffff;
      pMVar11 = pMVar7;
      do {
        pMVar11 = pMVar11->pNext;
        uVar10 = uVar10 + 1;
      } while (pMVar11 != (Min_Cube_t *)0x0);
      if (uVar8 <= uVar10) goto LAB_008bede5;
      goto LAB_008bee1a;
    }
    bVar3 = true;
LAB_008bee65:
    if (pCube == (Min_Cube_t *)0x0) {
LAB_008bf096:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covBuild.c"
                    ,0x1ba,"Abc_Obj_t *Abc_NtkCovDerive_rec(Cov_Man_t *, Abc_Ntk_t *, Abc_Obj_t *)")
      ;
    }
    if (pMVar7 != (Min_Cube_t *)0x0) {
      uVar8 = 0xffffffff;
      pMVar11 = pCube;
      do {
        pMVar11 = pMVar11->pNext;
        uVar8 = uVar8 + 1;
      } while (pMVar11 != (Min_Cube_t *)0x0);
      uVar10 = 0xffffffff;
      do {
        pMVar7 = pMVar7->pNext;
        uVar10 = uVar10 + 1;
      } while (pMVar7 != (Min_Cube_t *)0x0);
      if (uVar10 <= uVar8) goto LAB_008bf096;
    }
    if (bVar3) {
      uStack_38 = 0x78000000;
    }
    else {
      uVar8 = 0xffffffff;
      pMVar7 = pCube;
      do {
        pMVar7 = pMVar7->pNext;
        uVar8 = uVar8 + 1;
      } while (pMVar7 != (Min_Cube_t *)0x0);
      uVar10 = 0xffffffff;
      do {
        pMVar5 = pMVar5->pNext;
        uVar10 = uVar10 + 1;
      } while (pMVar5 != (Min_Cube_t *)0x0);
      uStack_38 = 0x78000000;
      if (uVar10 <= uVar8) goto LAB_008bf096;
    }
  }
LAB_008beee5:
  if (0 < vSupp->nSize) {
    lVar9 = 0;
    do {
      iVar4 = vSupp->pArray[lVar9];
      if (((long)iVar4 < 0) || (pVVar2 = pObj->pNtk->vObjs, pVVar2->nSize <= iVar4))
      goto LAB_008bf039;
      Abc_NtkCovDerive_rec(p,pNtkNew,(Abc_Obj_t *)pVVar2->pArray[iVar4]);
      lVar9 = lVar9 + 1;
    } while (lVar9 < vSupp->nSize);
  }
  iVar4 = 1;
  pMVar7 = pCube;
  do {
    pMVar7 = pMVar7->pNext;
    iVar4 = iVar4 + -1;
  } while (pMVar7 != (Min_Cube_t *)0x0);
  if (iVar4 == 0) {
    pObj_00 = Abc_NtkCovDeriveCube(pNtkNew,pObj,pCube,vSupp,uStack_38._4_4_);
  }
  else {
    pObj_00 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
    if (0 < vSupp->nSize) {
      lVar9 = 0;
      do {
        iVar4 = vSupp->pArray[lVar9];
        if (((long)iVar4 < 0) || (pVVar2 = pObj->pNtk->vObjs, pVVar2->nSize <= iVar4))
        goto LAB_008bf039;
        Abc_ObjAddFanin(pObj_00,*(Abc_Obj_t **)((long)pVVar2->pArray[iVar4] + 0x40));
        lVar9 = lVar9 + 1;
      } while (lVar9 < vSupp->nSize);
    }
    vCover = (Vec_Str_t *)malloc(0x10);
    vCover->nCap = 100;
    vCover->nSize = 0;
    pcVar6 = (char *)malloc(100);
    vCover->pArray = pcVar6;
    Min_CoverCreate(vCover,pCube,uStack_38._3_1_);
    pcVar6 = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc,vCover->pArray);
    (pObj_00->field_5).pData = pcVar6;
    if (vCover->pArray != (char *)0x0) {
      free(vCover->pArray);
    }
    free(vCover);
  }
  (pObj->field_6).pCopy = pObj_00;
  return pObj_00;
}

Assistant:

Abc_Obj_t * Abc_NtkCovDerive_rec( Cov_Man_t * p, Abc_Ntk_t * pNtkNew, Abc_Obj_t * pObj )
{
    int fVerbose = 0;
    Min_Cube_t * pCover, * pCovers[3];
    Abc_Obj_t * pNodeNew, * pFanin;
    Vec_Int_t * vSupp;
    Vec_Str_t * vCover;
    int i, Entry, nCubes, Type = 0;
    // skip if already computed
    if ( pObj->pCopy )
        return pObj->pCopy;
    assert( Abc_ObjIsNode(pObj) );
    // get the support and the cover
    vSupp  = Abc_ObjGetSupp( pObj ); 
    assert( vSupp );
    // choose the cover to implement
    pCovers[0] = Abc_ObjGetCover( pObj, 0 );
    pCovers[1] = Abc_ObjGetCover( pObj, 1 );
    pCovers[2] = Abc_ObjGetCover2( pObj );
    // use positive polarity
    if ( pCovers[0] 
        && (!pCovers[1] || Min_CoverCountCubes(pCovers[0]) <= Min_CoverCountCubes(pCovers[1]))
        && (!pCovers[2] || Min_CoverCountCubes(pCovers[0]) <= Min_CoverCountCubes(pCovers[2]))   )
    {
        pCover = pCovers[0];
        Type = '1';
    }
    else 
    // use negative polarity
    if ( pCovers[1] 
        && (!pCovers[0] || Min_CoverCountCubes(pCovers[1]) <= Min_CoverCountCubes(pCovers[0]))
        && (!pCovers[2] || Min_CoverCountCubes(pCovers[1]) <= Min_CoverCountCubes(pCovers[2]))   )
    {
        pCover = pCovers[1];
        Type = '0';
    }
    else 
    // use XOR polarity
    if ( pCovers[2] 
        && (!pCovers[0] || Min_CoverCountCubes(pCovers[2]) < Min_CoverCountCubes(pCovers[0]))
        && (!pCovers[1] || Min_CoverCountCubes(pCovers[2]) < Min_CoverCountCubes(pCovers[1]))   )
    {
        pCover = pCovers[2];
        Type = 'x';
    }
    else
        assert( 0 );
    // print the support of this node
    if ( fVerbose )
    {
        printf( "{ " );
        Vec_IntForEachEntry( vSupp, Entry, i )
            printf( "%d ", Entry );
        printf( "}  cubes = %d\n", Min_CoverCountCubes( pCover ) );
    }
    // process the fanins
    Vec_IntForEachEntry( vSupp, Entry, i )
    {
        pFanin = Abc_NtkObj(pObj->pNtk, Entry);
        Abc_NtkCovDerive_rec( p, pNtkNew, pFanin );
    }
    // for each cube, construct the node
    nCubes = Min_CoverCountCubes( pCover );
    if ( nCubes == 0 )
        pNodeNew = Abc_NtkCreateNodeConst0(pNtkNew);
    else if ( nCubes == 1 )
        pNodeNew = Abc_NtkCovDeriveCube( pNtkNew, pObj, pCover, vSupp, Type == '0' );
    else
    {
        // create the node
        pNodeNew = Abc_NtkCreateNode( pNtkNew );
        Vec_IntForEachEntry( vSupp, Entry, i )
        {
            pFanin = Abc_NtkObj(pObj->pNtk, Entry);
            Abc_ObjAddFanin( pNodeNew, pFanin->pCopy );
        }
        // derive the function
        vCover = Vec_StrAlloc( 100 );
        Min_CoverCreate( vCover, pCover, (char)Type );
        pNodeNew->pData = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc, Vec_StrArray(vCover) );
        Vec_StrFree( vCover );
    }

/*
    printf( "Created node %d(%d) at level %d: ", pNodeNew->Id, pObj->Id, Level );
    Vec_IntForEachEntry( vSupp, Entry, i )
    {
        pFanin = Abc_NtkObj(pObj->pNtk, Entry);
        printf( "%d(%d) ", pFanin->pCopy->Id, pFanin->Id );
    }
    printf( "\n" );
    Min_CoverWrite( stdout, pCover );
*/
    return pObj->pCopy = pNodeNew;
}